

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_push_scissor(nk_command_buffer *b,nk_rect r)

{
  void *pvVar1;
  float local_30;
  float local_2c;
  nk_command_scissor *cmd;
  nk_command_buffer *b_local;
  nk_rect r_local;
  
  if (b == (nk_command_buffer *)0x0) {
    __assert_fail("b",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x2209,"void nk_push_scissor(struct nk_command_buffer *, struct nk_rect)");
  }
  if (b != (nk_command_buffer *)0x0) {
    b_local._0_4_ = r.x;
    (b->clip).x = b_local._0_4_;
    b_local._4_4_ = r.y;
    (b->clip).y = b_local._4_4_;
    r_local.x = r.w;
    (b->clip).w = r_local.x;
    r_local.y = r.h;
    (b->clip).h = r_local.y;
    pvVar1 = nk_command_buffer_push(b,NK_COMMAND_SCISSOR,0x18);
    if (pvVar1 != (void *)0x0) {
      *(short *)((long)pvVar1 + 0x10) = (short)(int)b_local._0_4_;
      *(short *)((long)pvVar1 + 0x12) = (short)(int)b_local._4_4_;
      if (r_local.x <= 0.0) {
        local_2c = 0.0;
      }
      else {
        local_2c = r_local.x;
      }
      *(short *)((long)pvVar1 + 0x14) = (short)(int)local_2c;
      if (r_local.y <= 0.0) {
        local_30 = 0.0;
      }
      else {
        local_30 = r_local.y;
      }
      *(short *)((long)pvVar1 + 0x16) = (short)(int)local_30;
    }
  }
  return;
}

Assistant:

NK_API void
nk_push_scissor(struct nk_command_buffer *b, struct nk_rect r)
{
    struct nk_command_scissor *cmd;
    NK_ASSERT(b);
    if (!b) return;

    b->clip.x = r.x;
    b->clip.y = r.y;
    b->clip.w = r.w;
    b->clip.h = r.h;
    cmd = (struct nk_command_scissor*)
        nk_command_buffer_push(b, NK_COMMAND_SCISSOR, sizeof(*cmd));

    if (!cmd) return;
    cmd->x = (short)r.x;
    cmd->y = (short)r.y;
    cmd->w = (unsigned short)NK_MAX(0, r.w);
    cmd->h = (unsigned short)NK_MAX(0, r.h);
}